

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  float **ppfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined4 uVar30;
  undefined1 (*pauVar31) [16];
  long lVar32;
  RayHitK<4> *pRVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  Scene *pSVar38;
  ulong uVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  ulong uVar42;
  Geometry *pGVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [16];
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  float fVar115;
  float fVar120;
  undefined1 auVar116 [16];
  float fVar118;
  float fVar119;
  undefined1 auVar117 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27c9;
  Scene *local_27c8;
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [16];
  undefined1 local_2790 [16];
  size_t local_2780;
  RayHitK<4> *local_2778;
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 (*local_2748) [16];
  long local_2740;
  long local_2738;
  ulong local_2730;
  ulong local_2728;
  undefined1 *local_2720;
  void *local_2718;
  RTCRayQueryContext *local_2710;
  RayHitK<4> *local_2708;
  undefined1 (*local_2700) [16];
  undefined4 local_26f8;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [16];
  undefined1 *local_26b0;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [2] [16];
  undefined1 local_2620 [32];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar31 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar30 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar30;
  local_23c0._0_4_ = uVar30;
  local_23c0._8_4_ = uVar30;
  local_23c0._12_4_ = uVar30;
  local_23c0._16_4_ = uVar30;
  local_23c0._20_4_ = uVar30;
  local_23c0._24_4_ = uVar30;
  local_23c0._28_4_ = uVar30;
  auVar89 = ZEXT3264(local_23c0);
  uVar30 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar30;
  local_23e0._0_4_ = uVar30;
  local_23e0._8_4_ = uVar30;
  local_23e0._12_4_ = uVar30;
  local_23e0._16_4_ = uVar30;
  local_23e0._20_4_ = uVar30;
  local_23e0._24_4_ = uVar30;
  local_23e0._28_4_ = uVar30;
  auVar96 = ZEXT3264(local_23e0);
  uVar30 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar30;
  local_2400._0_4_ = uVar30;
  local_2400._8_4_ = uVar30;
  local_2400._12_4_ = uVar30;
  local_2400._16_4_ = uVar30;
  local_2400._20_4_ = uVar30;
  local_2400._24_4_ = uVar30;
  local_2400._28_4_ = uVar30;
  auVar98 = ZEXT3264(local_2400);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar23 = fVar2 * 0.99999964;
  local_2420._4_4_ = fVar23;
  local_2420._0_4_ = fVar23;
  local_2420._8_4_ = fVar23;
  local_2420._12_4_ = fVar23;
  local_2420._16_4_ = fVar23;
  local_2420._20_4_ = fVar23;
  local_2420._24_4_ = fVar23;
  local_2420._28_4_ = fVar23;
  auVar104 = ZEXT3264(local_2420);
  fVar23 = fVar3 * 0.99999964;
  local_2440._4_4_ = fVar23;
  local_2440._0_4_ = fVar23;
  local_2440._8_4_ = fVar23;
  local_2440._12_4_ = fVar23;
  local_2440._16_4_ = fVar23;
  local_2440._20_4_ = fVar23;
  local_2440._24_4_ = fVar23;
  local_2440._28_4_ = fVar23;
  auVar106 = ZEXT3264(local_2440);
  fVar23 = fVar4 * 0.99999964;
  local_2460._4_4_ = fVar23;
  local_2460._0_4_ = fVar23;
  local_2460._8_4_ = fVar23;
  local_2460._12_4_ = fVar23;
  local_2460._16_4_ = fVar23;
  local_2460._20_4_ = fVar23;
  local_2460._24_4_ = fVar23;
  local_2460._28_4_ = fVar23;
  auVar107 = ZEXT3264(local_2460);
  fVar2 = fVar2 * 1.0000004;
  local_2480._4_4_ = fVar2;
  local_2480._0_4_ = fVar2;
  local_2480._8_4_ = fVar2;
  local_2480._12_4_ = fVar2;
  local_2480._16_4_ = fVar2;
  local_2480._20_4_ = fVar2;
  local_2480._24_4_ = fVar2;
  local_2480._28_4_ = fVar2;
  auVar108 = ZEXT3264(local_2480);
  fVar3 = fVar3 * 1.0000004;
  local_24a0._4_4_ = fVar3;
  local_24a0._0_4_ = fVar3;
  local_24a0._8_4_ = fVar3;
  local_24a0._12_4_ = fVar3;
  local_24a0._16_4_ = fVar3;
  local_24a0._20_4_ = fVar3;
  local_24a0._24_4_ = fVar3;
  local_24a0._28_4_ = fVar3;
  auVar111 = ZEXT3264(local_24a0);
  fVar4 = fVar4 * 1.0000004;
  local_24c0._4_4_ = fVar4;
  local_24c0._0_4_ = fVar4;
  local_24c0._8_4_ = fVar4;
  local_24c0._12_4_ = fVar4;
  local_24c0._16_4_ = fVar4;
  local_24c0._20_4_ = fVar4;
  local_24c0._24_4_ = fVar4;
  local_24c0._28_4_ = fVar4;
  auVar114 = ZEXT3264(local_24c0);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2728 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2730 = uVar44 ^ 0x20;
  uVar47 = local_2728 ^ 0x20;
  iVar5 = (tray->tnear).field_0.i[k];
  local_2620._4_4_ = iVar5;
  local_2620._0_4_ = iVar5;
  local_2620._8_4_ = iVar5;
  local_2620._12_4_ = iVar5;
  local_2620._16_4_ = iVar5;
  local_2620._20_4_ = iVar5;
  local_2620._24_4_ = iVar5;
  local_2620._28_4_ = iVar5;
  auVar117 = ZEXT3264(local_2620);
  iVar5 = (tray->tfar).field_0.i[k];
  auVar55 = ZEXT3264(CONCAT428(iVar5,CONCAT424(iVar5,CONCAT420(iVar5,CONCAT416(iVar5,CONCAT412(iVar5
                                                  ,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))))))));
  local_2748 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_2778 = ray;
  local_2780 = k;
LAB_005c9d6c:
  do {
    pauVar46 = pauVar31 + -1;
    pauVar31 = pauVar31 + -1;
    if (*(float *)(*pauVar46 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar39 = *(ulong *)*pauVar31;
      while ((uVar39 & 8) == 0) {
        auVar88 = auVar89._0_32_;
        auVar24 = vsubps_avx(*(undefined1 (*) [32])(uVar39 + 0x40 + uVar44),auVar88);
        auVar25._4_4_ = auVar104._4_4_ * auVar24._4_4_;
        auVar25._0_4_ = auVar104._0_4_ * auVar24._0_4_;
        auVar25._8_4_ = auVar104._8_4_ * auVar24._8_4_;
        auVar25._12_4_ = auVar104._12_4_ * auVar24._12_4_;
        auVar25._16_4_ = auVar104._16_4_ * auVar24._16_4_;
        auVar25._20_4_ = auVar104._20_4_ * auVar24._20_4_;
        auVar25._24_4_ = auVar104._24_4_ * auVar24._24_4_;
        auVar25._28_4_ = auVar24._28_4_;
        auVar95 = auVar96._0_32_;
        auVar24 = vsubps_avx(*(undefined1 (*) [32])(uVar39 + 0x40 + local_2728),auVar95);
        auVar97._4_4_ = auVar106._4_4_ * auVar24._4_4_;
        auVar97._0_4_ = auVar106._0_4_ * auVar24._0_4_;
        auVar97._8_4_ = auVar106._8_4_ * auVar24._8_4_;
        auVar97._12_4_ = auVar106._12_4_ * auVar24._12_4_;
        auVar97._16_4_ = auVar106._16_4_ * auVar24._16_4_;
        auVar97._20_4_ = auVar106._20_4_ * auVar24._20_4_;
        auVar97._24_4_ = auVar106._24_4_ * auVar24._24_4_;
        auVar97._28_4_ = auVar24._28_4_;
        auVar24 = vmaxps_avx(auVar25,auVar97);
        auVar97 = auVar98._0_32_;
        auVar25 = vsubps_avx(*(undefined1 (*) [32])(uVar39 + 0x40 + uVar45),auVar97);
        auVar26._4_4_ = auVar107._4_4_ * auVar25._4_4_;
        auVar26._0_4_ = auVar107._0_4_ * auVar25._0_4_;
        auVar26._8_4_ = auVar107._8_4_ * auVar25._8_4_;
        auVar26._12_4_ = auVar107._12_4_ * auVar25._12_4_;
        auVar26._16_4_ = auVar107._16_4_ * auVar25._16_4_;
        auVar26._20_4_ = auVar107._20_4_ * auVar25._20_4_;
        auVar26._24_4_ = auVar107._24_4_ * auVar25._24_4_;
        auVar26._28_4_ = auVar25._28_4_;
        auVar25 = vmaxps_avx(auVar26,auVar117._0_32_);
        local_26e0 = vmaxps_avx(auVar24,auVar25);
        auVar24 = vsubps_avx(*(undefined1 (*) [32])(uVar39 + 0x40 + local_2730),auVar88);
        auVar27._4_4_ = auVar108._4_4_ * auVar24._4_4_;
        auVar27._0_4_ = auVar108._0_4_ * auVar24._0_4_;
        auVar27._8_4_ = auVar108._8_4_ * auVar24._8_4_;
        auVar27._12_4_ = auVar108._12_4_ * auVar24._12_4_;
        auVar27._16_4_ = auVar108._16_4_ * auVar24._16_4_;
        auVar27._20_4_ = auVar108._20_4_ * auVar24._20_4_;
        auVar27._24_4_ = auVar108._24_4_ * auVar24._24_4_;
        auVar27._28_4_ = auVar24._28_4_;
        auVar24 = vsubps_avx(*(undefined1 (*) [32])(uVar39 + 0x40 + uVar47),auVar95);
        auVar28._4_4_ = auVar111._4_4_ * auVar24._4_4_;
        auVar28._0_4_ = auVar111._0_4_ * auVar24._0_4_;
        auVar28._8_4_ = auVar111._8_4_ * auVar24._8_4_;
        auVar28._12_4_ = auVar111._12_4_ * auVar24._12_4_;
        auVar28._16_4_ = auVar111._16_4_ * auVar24._16_4_;
        auVar28._20_4_ = auVar111._20_4_ * auVar24._20_4_;
        auVar28._24_4_ = auVar111._24_4_ * auVar24._24_4_;
        auVar28._28_4_ = auVar24._28_4_;
        auVar24 = vminps_avx(auVar27,auVar28);
        auVar25 = vsubps_avx(*(undefined1 (*) [32])(uVar39 + 0x40 + (uVar45 ^ 0x20)),auVar97);
        auVar29._4_4_ = auVar114._4_4_ * auVar25._4_4_;
        auVar29._0_4_ = auVar114._0_4_ * auVar25._0_4_;
        auVar29._8_4_ = auVar114._8_4_ * auVar25._8_4_;
        auVar29._12_4_ = auVar114._12_4_ * auVar25._12_4_;
        auVar29._16_4_ = auVar114._16_4_ * auVar25._16_4_;
        auVar29._20_4_ = auVar114._20_4_ * auVar25._20_4_;
        auVar29._24_4_ = auVar114._24_4_ * auVar25._24_4_;
        auVar29._28_4_ = auVar25._28_4_;
        auVar25 = vminps_avx(auVar29,auVar55._0_32_);
        auVar24 = vminps_avx(auVar24,auVar25);
        auVar24 = vcmpps_avx(local_26e0,auVar24,2);
        uVar35 = vmovmskps_avx(auVar24);
        if (uVar35 == 0) {
          if (pauVar31 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005c9d6c;
        }
        uVar35 = uVar35 & 0xff;
        uVar34 = uVar39 & 0xfffffffffffffff0;
        lVar32 = 0;
        for (uVar39 = (ulong)uVar35; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar39 = *(ulong *)(uVar34 + lVar32 * 8);
        uVar35 = uVar35 - 1 & uVar35;
        uVar36 = (ulong)uVar35;
        if (uVar35 != 0) {
          uVar7 = *(uint *)(local_26e0 + lVar32 * 4);
          lVar32 = 0;
          for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            lVar32 = lVar32 + 1;
          }
          uVar35 = uVar35 - 1 & uVar35;
          uVar42 = (ulong)uVar35;
          uVar36 = *(ulong *)(uVar34 + lVar32 * 8);
          uVar8 = *(uint *)(local_26e0 + lVar32 * 4);
          if (uVar35 == 0) {
            if (uVar7 < uVar8) {
              *(ulong *)*pauVar31 = uVar36;
              *(uint *)(*pauVar31 + 8) = uVar8;
              pauVar31 = pauVar31 + 1;
            }
            else {
              *(ulong *)*pauVar31 = uVar39;
              *(uint *)(*pauVar31 + 8) = uVar7;
              pauVar31 = pauVar31 + 1;
              uVar39 = uVar36;
            }
          }
          else {
            auVar56._8_8_ = 0;
            auVar56._0_8_ = uVar39;
            auVar56 = vpunpcklqdq_avx(auVar56,ZEXT416(uVar7));
            auVar64._8_8_ = 0;
            auVar64._0_8_ = uVar36;
            auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar8));
            lVar32 = 0;
            for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar32 = lVar32 + 1;
            }
            uVar35 = uVar35 - 1 & uVar35;
            uVar39 = (ulong)uVar35;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = *(ulong *)(uVar34 + lVar32 * 8);
            auVar57 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_26e0 + lVar32 * 4)));
            auVar67 = vpcmpgtd_avx(auVar64,auVar56);
            if (uVar35 == 0) {
              auVar77 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar64,auVar56,auVar77);
              auVar56 = vblendvps_avx(auVar56,auVar64,auVar77);
              auVar64 = vpcmpgtd_avx(auVar57,auVar67);
              auVar77 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar57,auVar67,auVar77);
              auVar67 = vblendvps_avx(auVar67,auVar57,auVar77);
              auVar57 = vpcmpgtd_avx(auVar67,auVar56);
              auVar77 = vpshufd_avx(auVar57,0xaa);
              auVar57 = vblendvps_avx(auVar67,auVar56,auVar77);
              auVar56 = vblendvps_avx(auVar56,auVar67,auVar77);
              *pauVar31 = auVar56;
              pauVar31[1] = auVar57;
              uVar39 = auVar64._0_8_;
              pauVar31 = pauVar31 + 2;
            }
            else {
              lVar32 = 0;
              for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                lVar32 = lVar32 + 1;
              }
              uVar35 = uVar35 - 1 & uVar35;
              uVar36 = (ulong)uVar35;
              auVar77._8_8_ = 0;
              auVar77._0_8_ = *(ulong *)(uVar34 + lVar32 * 8);
              auVar77 = vpunpcklqdq_avx(auVar77,ZEXT416(*(uint *)(local_26e0 + lVar32 * 4)));
              if (uVar35 == 0) {
                auVar59 = vpshufd_avx(auVar67,0xaa);
                auVar67 = vblendvps_avx(auVar64,auVar56,auVar59);
                auVar56 = vblendvps_avx(auVar56,auVar64,auVar59);
                auVar64 = vpcmpgtd_avx(auVar77,auVar57);
                auVar59 = vpshufd_avx(auVar64,0xaa);
                auVar64 = vblendvps_avx(auVar77,auVar57,auVar59);
                auVar57 = vblendvps_avx(auVar57,auVar77,auVar59);
                auVar77 = vpcmpgtd_avx(auVar57,auVar56);
                auVar59 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar57,auVar56,auVar59);
                auVar56 = vblendvps_avx(auVar56,auVar57,auVar59);
                auVar57 = vpcmpgtd_avx(auVar64,auVar67);
                auVar59 = vpshufd_avx(auVar57,0xaa);
                auVar57 = vblendvps_avx(auVar64,auVar67,auVar59);
                auVar64 = vblendvps_avx(auVar67,auVar64,auVar59);
                auVar67 = vpcmpgtd_avx(auVar77,auVar64);
                auVar59 = vpshufd_avx(auVar67,0xaa);
                auVar67 = vblendvps_avx(auVar77,auVar64,auVar59);
                auVar64 = vblendvps_avx(auVar64,auVar77,auVar59);
                *pauVar31 = auVar56;
                pauVar31[1] = auVar64;
                pauVar31[2] = auVar67;
                uVar39 = auVar57._0_8_;
                pauVar46 = pauVar31 + 3;
              }
              else {
                *pauVar31 = auVar56;
                pauVar31[1] = auVar64;
                pauVar31[2] = auVar57;
                pauVar31[3] = auVar77;
                lVar32 = 0x30;
                do {
                  lVar40 = lVar32;
                  lVar32 = 0;
                  for (uVar39 = uVar36; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                      ) {
                    lVar32 = lVar32 + 1;
                  }
                  uVar39 = *(ulong *)(uVar34 + lVar32 * 8);
                  auVar57._8_8_ = 0;
                  auVar57._0_8_ = uVar39;
                  auVar56 = vpunpcklqdq_avx(auVar57,ZEXT416(*(uint *)(local_26e0 + lVar32 * 4)));
                  *(undefined1 (*) [16])(pauVar31[1] + lVar40) = auVar56;
                  uVar36 = uVar36 - 1 & uVar36;
                  lVar32 = lVar40 + 0x10;
                } while (uVar36 != 0);
                pauVar46 = (undefined1 (*) [16])(pauVar31[1] + lVar40);
                if (lVar40 + 0x10 != 0) {
                  lVar32 = 0x10;
                  pauVar37 = pauVar31;
                  do {
                    auVar56 = pauVar37[1];
                    pauVar37 = pauVar37 + 1;
                    uVar35 = vextractps_avx(auVar56,2);
                    lVar40 = lVar32;
                    do {
                      if (uVar35 <= *(uint *)(pauVar31[-1] + lVar40 + 8)) {
                        pauVar41 = (undefined1 (*) [16])(*pauVar31 + lVar40);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar31 + lVar40) =
                           *(undefined1 (*) [16])(pauVar31[-1] + lVar40);
                      lVar40 = lVar40 + -0x10;
                      pauVar41 = pauVar31;
                    } while (lVar40 != 0);
                    *pauVar41 = auVar56;
                    lVar32 = lVar32 + 0x10;
                  } while (pauVar46 != pauVar37);
                  uVar39 = *(ulong *)*pauVar46;
                }
              }
              auVar89 = ZEXT3264(auVar88);
              auVar96 = ZEXT3264(auVar95);
              auVar98 = ZEXT3264(auVar97);
              auVar104 = ZEXT3264(auVar104._0_32_);
              auVar106 = ZEXT3264(auVar106._0_32_);
              auVar107 = ZEXT3264(auVar107._0_32_);
              auVar108 = ZEXT3264(auVar108._0_32_);
              auVar111 = ZEXT3264(auVar111._0_32_);
              auVar114 = ZEXT3264(auVar114._0_32_);
              auVar117 = ZEXT3264(local_2620);
              pauVar31 = pauVar46;
            }
          }
        }
      }
      local_2740 = (ulong)((uint)uVar39 & 0xf) - 8;
      if (local_2740 != 0) {
        uVar39 = uVar39 & 0xfffffffffffffff0;
        local_2738 = 0;
        do {
          lVar32 = local_2738 * 0x50;
          pSVar38 = context->scene;
          ppfVar9 = (pSVar38->vertices).items;
          pfVar10 = ppfVar9[*(uint *)(uVar39 + 0x30 + lVar32)];
          pfVar11 = ppfVar9[*(uint *)(uVar39 + 0x34 + lVar32)];
          pfVar12 = ppfVar9[*(uint *)(uVar39 + 0x38 + lVar32)];
          pfVar13 = ppfVar9[*(uint *)(uVar39 + 0x3c + lVar32)];
          auVar67 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar39 + lVar32)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar39 + 8 + lVar32)));
          auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar39 + lVar32)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar39 + 8 + lVar32)));
          auVar57 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar39 + 4 + lVar32)),
                                  *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar39 + 0xc + lVar32))
                                 );
          auVar64 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar39 + 4 + lVar32)),
                                  *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar39 + 0xc + lVar32))
                                 );
          auVar59 = vunpcklps_avx(auVar56,auVar64);
          auVar71 = vunpcklps_avx(auVar67,auVar57);
          auVar56 = vunpckhps_avx(auVar67,auVar57);
          auVar57 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar39 + 0x10 + lVar32)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar39 + 0x18 + lVar32)));
          auVar64 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar39 + 0x10 + lVar32)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar39 + 0x18 + lVar32)));
          auVar77 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar39 + 0x14 + lVar32)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar39 + 0x1c + lVar32)));
          auVar67 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar39 + 0x14 + lVar32)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar39 + 0x1c + lVar32)));
          auVar50 = vunpcklps_avx(auVar64,auVar67);
          auVar48 = vunpcklps_avx(auVar57,auVar77);
          auVar64 = vunpckhps_avx(auVar57,auVar77);
          auVar77 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar39 + 0x20 + lVar32)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar39 + 0x28 + lVar32)));
          auVar67 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar39 + 0x20 + lVar32)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar39 + 0x28 + lVar32)));
          auVar49 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar39 + 0x24 + lVar32)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar39 + 0x2c + lVar32)));
          auVar57 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar39 + 0x24 + lVar32)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar39 + 0x2c + lVar32)));
          auVar58 = vunpcklps_avx(auVar67,auVar57);
          auVar57 = vunpcklps_avx(auVar77,auVar49);
          auVar77 = vunpckhps_avx(auVar77,auVar49);
          puVar1 = (undefined8 *)(uVar39 + 0x30 + lVar32);
          local_2560 = *puVar1;
          uStack_2558 = puVar1[1];
          puVar1 = (undefined8 *)(uVar39 + 0x40 + lVar32);
          local_26f0 = *puVar1;
          uStack_26e8 = puVar1[1];
          uVar30 = *(undefined4 *)(ray + k * 4);
          auVar105._4_4_ = uVar30;
          auVar105._0_4_ = uVar30;
          auVar105._8_4_ = uVar30;
          auVar105._12_4_ = uVar30;
          uVar30 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar109._4_4_ = uVar30;
          auVar109._0_4_ = uVar30;
          auVar109._8_4_ = uVar30;
          auVar109._12_4_ = uVar30;
          uVar30 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar112._4_4_ = uVar30;
          auVar112._0_4_ = uVar30;
          auVar112._8_4_ = uVar30;
          auVar112._12_4_ = uVar30;
          local_2770 = vsubps_avx(auVar71,auVar105);
          local_2570 = vsubps_avx(auVar56,auVar109);
          local_2580 = vsubps_avx(auVar59,auVar112);
          auVar56 = vsubps_avx(auVar48,auVar105);
          auVar64 = vsubps_avx(auVar64,auVar109);
          auVar67 = vsubps_avx(auVar50,auVar112);
          auVar57 = vsubps_avx(auVar57,auVar105);
          auVar77 = vsubps_avx(auVar77,auVar109);
          auVar59 = vsubps_avx(auVar58,auVar112);
          local_2590 = vsubps_avx(auVar57,local_2770);
          local_25b0 = vsubps_avx(auVar77,local_2570);
          local_25a0 = vsubps_avx(auVar59,local_2580);
          auVar48._0_4_ = auVar57._0_4_ + local_2770._0_4_;
          auVar48._4_4_ = auVar57._4_4_ + local_2770._4_4_;
          auVar48._8_4_ = auVar57._8_4_ + local_2770._8_4_;
          auVar48._12_4_ = auVar57._12_4_ + local_2770._12_4_;
          auVar68._0_4_ = auVar77._0_4_ + local_2570._0_4_;
          auVar68._4_4_ = auVar77._4_4_ + local_2570._4_4_;
          auVar68._8_4_ = auVar77._8_4_ + local_2570._8_4_;
          auVar68._12_4_ = auVar77._12_4_ + local_2570._12_4_;
          fVar3 = local_2580._0_4_;
          auVar71._0_4_ = auVar59._0_4_ + fVar3;
          fVar4 = local_2580._4_4_;
          auVar71._4_4_ = auVar59._4_4_ + fVar4;
          fVar23 = local_2580._8_4_;
          auVar71._8_4_ = auVar59._8_4_ + fVar23;
          fVar14 = local_2580._12_4_;
          auVar71._12_4_ = auVar59._12_4_ + fVar14;
          auVar110._0_4_ = local_25a0._0_4_ * auVar68._0_4_;
          auVar110._4_4_ = local_25a0._4_4_ * auVar68._4_4_;
          auVar110._8_4_ = local_25a0._8_4_ * auVar68._8_4_;
          auVar110._12_4_ = local_25a0._12_4_ * auVar68._12_4_;
          auVar50 = vfmsub231ps_fma(auVar110,local_25b0,auVar71);
          auVar72._0_4_ = local_2590._0_4_ * auVar71._0_4_;
          auVar72._4_4_ = local_2590._4_4_ * auVar71._4_4_;
          auVar72._8_4_ = local_2590._8_4_ * auVar71._8_4_;
          auVar72._12_4_ = local_2590._12_4_ * auVar71._12_4_;
          auVar71 = vfmsub231ps_fma(auVar72,local_25a0,auVar48);
          auVar49._0_4_ = local_25b0._0_4_ * auVar48._0_4_;
          auVar49._4_4_ = local_25b0._4_4_ * auVar48._4_4_;
          auVar49._8_4_ = local_25b0._8_4_ * auVar48._8_4_;
          auVar49._12_4_ = local_25b0._12_4_ * auVar48._12_4_;
          auVar48 = vfmsub231ps_fma(auVar49,local_2590,auVar68);
          fVar2 = *(float *)(ray + k * 4 + 0x60);
          auVar65._0_4_ = fVar2 * auVar48._0_4_;
          auVar65._4_4_ = fVar2 * auVar48._4_4_;
          auVar65._8_4_ = fVar2 * auVar48._8_4_;
          auVar65._12_4_ = fVar2 * auVar48._12_4_;
          uVar30 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar99._4_4_ = uVar30;
          auVar99._0_4_ = uVar30;
          auVar99._8_4_ = uVar30;
          auVar99._12_4_ = uVar30;
          auVar71 = vfmadd231ps_fma(auVar65,auVar99,auVar71);
          uVar30 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar113._4_4_ = uVar30;
          auVar113._0_4_ = uVar30;
          auVar113._8_4_ = uVar30;
          auVar113._12_4_ = uVar30;
          local_25f0 = vfmadd231ps_fma(auVar71,auVar113,auVar50);
          local_25c0 = vsubps_avx(local_2570,auVar64);
          local_25e0 = vsubps_avx(local_2580,auVar67);
          auVar69._0_4_ = local_2570._0_4_ + auVar64._0_4_;
          auVar69._4_4_ = local_2570._4_4_ + auVar64._4_4_;
          auVar69._8_4_ = local_2570._8_4_ + auVar64._8_4_;
          auVar69._12_4_ = local_2570._12_4_ + auVar64._12_4_;
          auVar73._0_4_ = auVar67._0_4_ + fVar3;
          auVar73._4_4_ = auVar67._4_4_ + fVar4;
          auVar73._8_4_ = auVar67._8_4_ + fVar23;
          auVar73._12_4_ = auVar67._12_4_ + fVar14;
          fVar15 = local_25e0._0_4_;
          auVar81._0_4_ = auVar69._0_4_ * fVar15;
          fVar17 = local_25e0._4_4_;
          auVar81._4_4_ = auVar69._4_4_ * fVar17;
          fVar19 = local_25e0._8_4_;
          auVar81._8_4_ = auVar69._8_4_ * fVar19;
          fVar21 = local_25e0._12_4_;
          auVar81._12_4_ = auVar69._12_4_ * fVar21;
          auVar50 = vfmsub231ps_fma(auVar81,local_25c0,auVar73);
          local_25d0 = vsubps_avx(local_2770,auVar56);
          fVar115 = local_25d0._0_4_;
          auVar90._0_4_ = fVar115 * auVar73._0_4_;
          fVar118 = local_25d0._4_4_;
          auVar90._4_4_ = fVar118 * auVar73._4_4_;
          fVar119 = local_25d0._8_4_;
          auVar90._8_4_ = fVar119 * auVar73._8_4_;
          fVar120 = local_25d0._12_4_;
          auVar90._12_4_ = fVar120 * auVar73._12_4_;
          auVar74._0_4_ = auVar56._0_4_ + local_2770._0_4_;
          auVar74._4_4_ = auVar56._4_4_ + local_2770._4_4_;
          auVar74._8_4_ = auVar56._8_4_ + local_2770._8_4_;
          auVar74._12_4_ = auVar56._12_4_ + local_2770._12_4_;
          auVar71 = vfmsub231ps_fma(auVar90,local_25e0,auVar74);
          fVar16 = local_25c0._0_4_;
          auVar75._0_4_ = auVar74._0_4_ * fVar16;
          fVar18 = local_25c0._4_4_;
          auVar75._4_4_ = auVar74._4_4_ * fVar18;
          fVar20 = local_25c0._8_4_;
          auVar75._8_4_ = auVar74._8_4_ * fVar20;
          fVar22 = local_25c0._12_4_;
          auVar75._12_4_ = auVar74._12_4_ * fVar22;
          auVar48 = vfmsub231ps_fma(auVar75,local_25d0,auVar69);
          auVar76._0_4_ = fVar2 * auVar48._0_4_;
          auVar76._4_4_ = fVar2 * auVar48._4_4_;
          auVar76._8_4_ = fVar2 * auVar48._8_4_;
          auVar76._12_4_ = fVar2 * auVar48._12_4_;
          auVar71 = vfmadd231ps_fma(auVar76,auVar99,auVar71);
          local_26e0._16_16_ = vfmadd231ps_fma(auVar71,auVar113,auVar50);
          auVar71 = vsubps_avx(auVar56,auVar57);
          auVar82._0_4_ = auVar56._0_4_ + auVar57._0_4_;
          auVar82._4_4_ = auVar56._4_4_ + auVar57._4_4_;
          auVar82._8_4_ = auVar56._8_4_ + auVar57._8_4_;
          auVar82._12_4_ = auVar56._12_4_ + auVar57._12_4_;
          auVar57 = vsubps_avx(auVar64,auVar77);
          auVar50._0_4_ = auVar64._0_4_ + auVar77._0_4_;
          auVar50._4_4_ = auVar64._4_4_ + auVar77._4_4_;
          auVar50._8_4_ = auVar64._8_4_ + auVar77._8_4_;
          auVar50._12_4_ = auVar64._12_4_ + auVar77._12_4_;
          auVar77 = vsubps_avx(auVar67,auVar59);
          auVar58._0_4_ = auVar67._0_4_ + auVar59._0_4_;
          auVar58._4_4_ = auVar67._4_4_ + auVar59._4_4_;
          auVar58._8_4_ = auVar67._8_4_ + auVar59._8_4_;
          auVar58._12_4_ = auVar67._12_4_ + auVar59._12_4_;
          auVar91._0_4_ = auVar50._0_4_ * auVar77._0_4_;
          auVar91._4_4_ = auVar50._4_4_ * auVar77._4_4_;
          auVar91._8_4_ = auVar50._8_4_ * auVar77._8_4_;
          auVar91._12_4_ = auVar50._12_4_ * auVar77._12_4_;
          auVar64 = vfmsub231ps_fma(auVar91,auVar57,auVar58);
          auVar59._0_4_ = auVar58._0_4_ * auVar71._0_4_;
          auVar59._4_4_ = auVar58._4_4_ * auVar71._4_4_;
          auVar59._8_4_ = auVar58._8_4_ * auVar71._8_4_;
          auVar59._12_4_ = auVar58._12_4_ * auVar71._12_4_;
          auVar56 = vfmsub231ps_fma(auVar59,auVar77,auVar82);
          auVar83._0_4_ = auVar57._0_4_ * auVar82._0_4_;
          auVar83._4_4_ = auVar57._4_4_ * auVar82._4_4_;
          auVar83._8_4_ = auVar57._8_4_ * auVar82._8_4_;
          auVar83._12_4_ = auVar57._12_4_ * auVar82._12_4_;
          auVar67 = vfmsub231ps_fma(auVar83,auVar71,auVar50);
          auVar84._0_4_ = fVar2 * auVar67._0_4_;
          auVar84._4_4_ = fVar2 * auVar67._4_4_;
          auVar84._8_4_ = fVar2 * auVar67._8_4_;
          auVar84._12_4_ = fVar2 * auVar67._12_4_;
          auVar56 = vfmadd231ps_fma(auVar84,auVar99,auVar56);
          auVar67 = vfmadd231ps_fma(auVar56,auVar113,auVar64);
          local_26c0._0_4_ = auVar67._0_4_ + local_25f0._0_4_ + local_26e0._16_4_;
          local_26c0._4_4_ = auVar67._4_4_ + local_25f0._4_4_ + local_26e0._20_4_;
          local_26c0._8_4_ = auVar67._8_4_ + local_25f0._8_4_ + local_26e0._24_4_;
          local_26c0._12_4_ = auVar67._12_4_ + local_25f0._12_4_ + local_26e0._28_4_;
          auVar116._8_4_ = 0x7fffffff;
          auVar116._0_8_ = 0x7fffffff7fffffff;
          auVar116._12_4_ = 0x7fffffff;
          auVar56 = vminps_avx(local_25f0,local_26e0._16_16_);
          auVar56 = vminps_avx(auVar56,auVar67);
          local_2600 = vandps_avx(local_26c0,auVar116);
          auVar100._0_4_ = local_2600._0_4_ * 1.1920929e-07;
          auVar100._4_4_ = local_2600._4_4_ * 1.1920929e-07;
          auVar100._8_4_ = local_2600._8_4_ * 1.1920929e-07;
          auVar100._12_4_ = local_2600._12_4_ * 1.1920929e-07;
          uVar34 = CONCAT44(auVar100._4_4_,auVar100._0_4_);
          auVar92._0_8_ = uVar34 ^ 0x8000000080000000;
          auVar92._8_4_ = -auVar100._8_4_;
          auVar92._12_4_ = -auVar100._12_4_;
          auVar56 = vcmpps_avx(auVar56,auVar92,5);
          auVar64 = vmaxps_avx(local_25f0,local_26e0._16_16_);
          auVar64 = vmaxps_avx(auVar64,auVar67);
          auVar64 = vcmpps_avx(auVar64,auVar100,2);
          local_27c0 = vorps_avx(auVar56,auVar64);
          if ((((local_27c0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_27c0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_27c0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_27c0[0xf] < '\0') {
            auVar60._0_4_ = fVar16 * local_25a0._0_4_;
            auVar60._4_4_ = fVar18 * local_25a0._4_4_;
            auVar60._8_4_ = fVar20 * local_25a0._8_4_;
            auVar60._12_4_ = fVar22 * local_25a0._12_4_;
            auVar85._0_4_ = fVar115 * local_25b0._0_4_;
            auVar85._4_4_ = fVar118 * local_25b0._4_4_;
            auVar85._8_4_ = fVar119 * local_25b0._8_4_;
            auVar85._12_4_ = fVar120 * local_25b0._12_4_;
            auVar67 = vfmsub213ps_fma(local_25b0,local_25e0,auVar60);
            auVar93._0_4_ = auVar57._0_4_ * fVar15;
            auVar93._4_4_ = auVar57._4_4_ * fVar17;
            auVar93._8_4_ = auVar57._8_4_ * fVar19;
            auVar93._12_4_ = auVar57._12_4_ * fVar21;
            auVar101._0_4_ = fVar115 * auVar77._0_4_;
            auVar101._4_4_ = fVar118 * auVar77._4_4_;
            auVar101._8_4_ = fVar119 * auVar77._8_4_;
            auVar101._12_4_ = fVar120 * auVar77._12_4_;
            auVar77 = vfmsub213ps_fma(auVar77,local_25c0,auVar93);
            auVar56 = vandps_avx(auVar116,auVar60);
            auVar64 = vandps_avx(auVar116,auVar93);
            auVar56 = vcmpps_avx(auVar56,auVar64,1);
            local_2660 = vblendvps_avx(auVar77,auVar67,auVar56);
            auVar78._0_4_ = fVar16 * auVar71._0_4_;
            auVar78._4_4_ = fVar18 * auVar71._4_4_;
            auVar78._8_4_ = fVar20 * auVar71._8_4_;
            auVar78._12_4_ = fVar22 * auVar71._12_4_;
            auVar67 = vfmsub213ps_fma(auVar71,local_25e0,auVar101);
            auVar94._0_4_ = local_2590._0_4_ * fVar15;
            auVar94._4_4_ = local_2590._4_4_ * fVar17;
            auVar94._8_4_ = local_2590._8_4_ * fVar19;
            auVar94._12_4_ = local_2590._12_4_ * fVar21;
            auVar77 = vfmsub213ps_fma(local_25a0,local_25d0,auVar94);
            auVar56 = vandps_avx(auVar116,auVar94);
            auVar64 = vandps_avx(auVar101,auVar116);
            auVar56 = vcmpps_avx(auVar56,auVar64,1);
            local_2650 = vblendvps_avx(auVar67,auVar77,auVar56);
            auVar67 = vfmsub213ps_fma(local_2590,local_25c0,auVar85);
            auVar57 = vfmsub213ps_fma(auVar57,local_25d0,auVar78);
            auVar56 = vandps_avx(auVar116,auVar85);
            auVar64 = vandps_avx(auVar116,auVar78);
            auVar56 = vcmpps_avx(auVar56,auVar64,1);
            local_2640[0] = vblendvps_avx(auVar57,auVar67,auVar56);
            auVar79._0_4_ = local_2640[0]._0_4_ * fVar2;
            auVar79._4_4_ = local_2640[0]._4_4_ * fVar2;
            auVar79._8_4_ = local_2640[0]._8_4_ * fVar2;
            auVar79._12_4_ = local_2640[0]._12_4_ * fVar2;
            auVar56 = vfmadd213ps_fma(auVar99,local_2650,auVar79);
            auVar56 = vfmadd213ps_fma(auVar113,local_2660,auVar56);
            auVar80._0_4_ = auVar56._0_4_ + auVar56._0_4_;
            auVar80._4_4_ = auVar56._4_4_ + auVar56._4_4_;
            auVar80._8_4_ = auVar56._8_4_ + auVar56._8_4_;
            auVar80._12_4_ = auVar56._12_4_ + auVar56._12_4_;
            auVar86._0_4_ = local_2640[0]._0_4_ * fVar3;
            auVar86._4_4_ = local_2640[0]._4_4_ * fVar4;
            auVar86._8_4_ = local_2640[0]._8_4_ * fVar23;
            auVar86._12_4_ = local_2640[0]._12_4_ * fVar14;
            auVar56 = vfmadd213ps_fma(local_2570,local_2650,auVar86);
            auVar64 = vfmadd213ps_fma(local_2770,local_2660,auVar56);
            auVar56 = vrcpps_avx(auVar80);
            auVar102._8_4_ = 0x3f800000;
            auVar102._0_8_ = 0x3f8000003f800000;
            auVar102._12_4_ = 0x3f800000;
            auVar67 = vfnmadd213ps_fma(auVar56,auVar80,auVar102);
            auVar56 = vfmadd132ps_fma(auVar67,auVar56,auVar56);
            local_2670._0_4_ = auVar56._0_4_ * (auVar64._0_4_ + auVar64._0_4_);
            local_2670._4_4_ = auVar56._4_4_ * (auVar64._4_4_ + auVar64._4_4_);
            local_2670._8_4_ = auVar56._8_4_ * (auVar64._8_4_ + auVar64._8_4_);
            local_2670._12_4_ = auVar56._12_4_ * (auVar64._12_4_ + auVar64._12_4_);
            auVar89 = ZEXT1664(local_2670);
            uVar30 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar87._4_4_ = uVar30;
            auVar87._0_4_ = uVar30;
            auVar87._8_4_ = uVar30;
            auVar87._12_4_ = uVar30;
            auVar56 = vcmpps_avx(auVar87,local_2670,2);
            uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar103._4_4_ = uVar30;
            auVar103._0_4_ = uVar30;
            auVar103._8_4_ = uVar30;
            auVar103._12_4_ = uVar30;
            auVar96 = ZEXT1664(auVar103);
            auVar64 = vcmpps_avx(local_2670,auVar103,2);
            auVar56 = vandps_avx(auVar56,auVar64);
            auVar64 = local_27c0 & auVar56;
            if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar64[0xf] < '\0') {
              auVar56 = vandps_avx(auVar56,local_27c0);
              auVar64 = vcmpps_avx(auVar80,_DAT_01f7aa10,4);
              auVar67 = auVar64 & auVar56;
              if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar67[0xf] < '\0') {
                local_2790 = vandps_avx(auVar56,auVar64);
                local_26e0._0_16_ = local_25f0;
                local_26b0 = &local_27c9;
                local_26a0 = local_2790;
                auVar56 = vrcpps_avx(local_26c0);
                auVar66._8_4_ = 0x3f800000;
                auVar66._0_8_ = 0x3f8000003f800000;
                auVar66._12_4_ = 0x3f800000;
                auVar64 = vfnmadd213ps_fma(local_26c0,auVar56,auVar66);
                auVar64 = vfmadd132ps_fma(auVar64,auVar56,auVar56);
                auVar61._8_4_ = 0x219392ef;
                auVar61._0_8_ = 0x219392ef219392ef;
                auVar61._12_4_ = 0x219392ef;
                auVar56 = vcmpps_avx(local_2600,auVar61,5);
                auVar56 = vandps_avx(auVar64,auVar56);
                auVar51._0_4_ = local_25f0._0_4_ * auVar56._0_4_;
                auVar51._4_4_ = local_25f0._4_4_ * auVar56._4_4_;
                auVar51._8_4_ = local_25f0._8_4_ * auVar56._8_4_;
                auVar51._12_4_ = local_25f0._12_4_ * auVar56._12_4_;
                local_2690 = vminps_avx(auVar51,auVar66);
                auVar52._0_4_ = auVar56._0_4_ * local_26e0._16_4_;
                auVar52._4_4_ = auVar56._4_4_ * local_26e0._20_4_;
                auVar52._8_4_ = auVar56._8_4_ * local_26e0._24_4_;
                auVar52._12_4_ = auVar56._12_4_ * local_26e0._28_4_;
                local_2680 = vminps_avx(auVar52,auVar66);
                auVar62._8_4_ = 0x7f800000;
                auVar62._0_8_ = 0x7f8000007f800000;
                auVar62._12_4_ = 0x7f800000;
                auVar56 = vblendvps_avx(auVar62,local_2670,local_2790);
                auVar64 = vshufps_avx(auVar56,auVar56,0xb1);
                auVar64 = vminps_avx(auVar64,auVar56);
                auVar67 = vshufpd_avx(auVar64,auVar64,1);
                auVar64 = vminps_avx(auVar67,auVar64);
                auVar56 = vcmpps_avx(auVar56,auVar64,0);
                auVar67 = local_2790 & auVar56;
                auVar64 = vpcmpeqd_avx(auVar64,auVar64);
                if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar67[0xf] < '\0') {
                  auVar64 = auVar56;
                }
                auVar56 = vandps_avx(local_2790,auVar64);
                uVar30 = vmovmskps_avx(auVar56);
                lVar32 = 0;
                for (uVar34 = CONCAT44((int)((ulong)&local_27c9 >> 0x20),uVar30);
                    local_27c8 = pSVar38, (uVar34 & 1) == 0;
                    uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                  lVar32 = lVar32 + 1;
                }
                do {
                  uVar35 = *(uint *)((long)&local_2560 + lVar32 * 4);
                  pRVar33 = (RayHitK<4> *)(ulong)uVar35;
                  pGVar43 = (pSVar38->geometries).items[(long)pRVar33].ptr;
                  if ((pGVar43->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    *(undefined4 *)(local_2790 + lVar32 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar43->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar30 = *(undefined4 *)(local_2690 + lVar32 * 4);
                      uVar6 = *(undefined4 *)(local_2680 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2670 + lVar32 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2660 + lVar32 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2650 + lVar32 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xe0) =
                           *(undefined4 *)(local_2640[0] + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)((long)&local_26f0 + lVar32 * 4);
                      *(uint *)(ray + k * 4 + 0x120) = uVar35;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar30 = *(undefined4 *)(local_2690 + lVar32 * 4);
                    local_2520._4_4_ = uVar30;
                    local_2520._0_4_ = uVar30;
                    local_2520._8_4_ = uVar30;
                    local_2520._12_4_ = uVar30;
                    local_2510 = *(undefined4 *)(local_2680 + lVar32 * 4);
                    local_24f0._4_4_ = uVar35;
                    local_24f0._0_4_ = uVar35;
                    local_24f0._8_4_ = uVar35;
                    local_24f0._12_4_ = uVar35;
                    uVar30 = *(undefined4 *)((long)&local_26f0 + lVar32 * 4);
                    auVar70._4_4_ = uVar30;
                    auVar70._0_4_ = uVar30;
                    auVar70._8_4_ = uVar30;
                    auVar70._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(local_2660 + lVar32 * 4);
                    local_2550._4_4_ = uVar30;
                    local_2550._0_4_ = uVar30;
                    local_2550._8_4_ = uVar30;
                    local_2550._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(local_2650 + lVar32 * 4);
                    local_2540._4_4_ = uVar30;
                    local_2540._0_4_ = uVar30;
                    local_2540._8_4_ = uVar30;
                    local_2540._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(local_2640[0] + lVar32 * 4);
                    local_2530._4_4_ = uVar30;
                    local_2530._0_4_ = uVar30;
                    local_2530._8_4_ = uVar30;
                    local_2530._12_4_ = uVar30;
                    uStack_250c = local_2510;
                    uStack_2508 = local_2510;
                    uStack_2504 = local_2510;
                    local_2500 = auVar70;
                    vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                    uStack_24dc = context->user->instID[0];
                    local_24e0 = uStack_24dc;
                    uStack_24d8 = uStack_24dc;
                    uStack_24d4 = uStack_24dc;
                    uStack_24d0 = context->user->instPrimID[0];
                    uStack_24cc = uStack_24d0;
                    uStack_24c8 = uStack_24d0;
                    uStack_24c4 = uStack_24d0;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2670 + lVar32 * 4);
                    local_2760 = *local_2748;
                    local_2720 = local_2760;
                    local_2718 = pGVar43->userPtr;
                    local_2710 = context->user;
                    local_2700 = &local_2550;
                    local_26f8 = 4;
                    pRVar33 = (RayHitK<4> *)pGVar43->intersectionFilterN;
                    local_27a0 = auVar89._0_16_;
                    local_27b0 = auVar96._0_16_;
                    local_27c0._0_8_ = lVar32;
                    local_2708 = ray;
                    if (pRVar33 != (RayHitK<4> *)0x0) {
                      local_2770._0_8_ = pGVar43;
                      pRVar33 = (RayHitK<4> *)(*(code *)pRVar33)(&local_2720);
                      auVar96 = ZEXT1664(local_27b0);
                      auVar89 = ZEXT1664(local_27a0);
                      pSVar38 = local_27c8;
                      lVar32 = local_27c0._0_8_;
                      pGVar43 = (Geometry *)local_2770._0_8_;
                      ray = local_2778;
                      k = local_2780;
                    }
                    if (local_2760 == (undefined1  [16])0x0) {
                      auVar56 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar56 = auVar56 ^ _DAT_01f7ae20;
                    }
                    else {
                      pRVar33 = (RayHitK<4> *)context->args->filter;
                      if ((pRVar33 != (RayHitK<4> *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar43->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar33 = (RayHitK<4> *)(*(code *)pRVar33)(&local_2720);
                        auVar96 = ZEXT1664(local_27b0);
                        auVar89 = ZEXT1664(local_27a0);
                        pSVar38 = local_27c8;
                        lVar32 = local_27c0._0_8_;
                        ray = local_2778;
                        k = local_2780;
                      }
                      auVar64 = vpcmpeqd_avx(local_2760,_DAT_01f7aa10);
                      auVar67 = vpcmpeqd_avx(auVar70,auVar70);
                      auVar56 = auVar64 ^ auVar67;
                      if (local_2760 != (undefined1  [16])0x0) {
                        auVar64 = auVar64 ^ auVar67;
                        auVar67 = vmaskmovps_avx(auVar64,*local_2700);
                        *(undefined1 (*) [16])(local_2708 + 0xc0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar64,local_2700[1]);
                        *(undefined1 (*) [16])(local_2708 + 0xd0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar64,local_2700[2]);
                        *(undefined1 (*) [16])(local_2708 + 0xe0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar64,local_2700[3]);
                        *(undefined1 (*) [16])(local_2708 + 0xf0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar64,local_2700[4]);
                        *(undefined1 (*) [16])(local_2708 + 0x100) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar64,local_2700[5]);
                        *(undefined1 (*) [16])(local_2708 + 0x110) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar64,local_2700[6]);
                        *(undefined1 (*) [16])(local_2708 + 0x120) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar64,local_2700[7]);
                        *(undefined1 (*) [16])(local_2708 + 0x130) = auVar67;
                        auVar64 = vmaskmovps_avx(auVar64,local_2700[8]);
                        *(undefined1 (*) [16])(local_2708 + 0x140) = auVar64;
                        pRVar33 = local_2708;
                      }
                    }
                    auVar53._8_8_ = 0x100000001;
                    auVar53._0_8_ = 0x100000001;
                    if ((auVar53 & auVar56) == (undefined1  [16])0x0) {
                      *(int *)(ray + k * 4 + 0x80) = auVar96._0_4_;
                    }
                    else {
                      auVar96 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    *(undefined4 *)(local_2790 + lVar32 * 4) = 0;
                    uVar30 = auVar96._0_4_;
                    auVar54._4_4_ = uVar30;
                    auVar54._0_4_ = uVar30;
                    auVar54._8_4_ = uVar30;
                    auVar54._12_4_ = uVar30;
                    auVar56 = vcmpps_avx(auVar89._0_16_,auVar54,2);
                    local_2790 = vandps_avx(auVar56,local_2790);
                  }
                  if ((((local_2790 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2790 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2790 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2790[0xf]) break;
                  auVar63._8_4_ = 0x7f800000;
                  auVar63._0_8_ = 0x7f8000007f800000;
                  auVar63._12_4_ = 0x7f800000;
                  auVar56 = vblendvps_avx(auVar63,auVar89._0_16_,local_2790);
                  auVar64 = vshufps_avx(auVar56,auVar56,0xb1);
                  auVar64 = vminps_avx(auVar64,auVar56);
                  auVar67 = vshufpd_avx(auVar64,auVar64,1);
                  auVar64 = vminps_avx(auVar67,auVar64);
                  auVar64 = vcmpps_avx(auVar56,auVar64,0);
                  auVar67 = local_2790 & auVar64;
                  auVar56 = local_2790;
                  if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar67[0xf] < '\0') {
                    auVar56 = vandps_avx(auVar64,local_2790);
                  }
                  uVar30 = vmovmskps_avx(auVar56);
                  lVar32 = 0;
                  for (uVar34 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar30); (uVar34 & 1) == 0;
                      uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                    lVar32 = lVar32 + 1;
                  }
                } while( true );
              }
            }
          }
          local_2738 = local_2738 + 1;
        } while (local_2738 != local_2740);
      }
      uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar55 = ZEXT3264(CONCAT428(uVar30,CONCAT424(uVar30,CONCAT420(uVar30,CONCAT416(uVar30,
                                                  CONCAT412(uVar30,CONCAT48(uVar30,CONCAT44(uVar30,
                                                  uVar30))))))));
      auVar89 = ZEXT3264(local_23c0);
      auVar96 = ZEXT3264(local_23e0);
      auVar98 = ZEXT3264(local_2400);
      auVar104 = ZEXT3264(local_2420);
      auVar106 = ZEXT3264(local_2440);
      auVar107 = ZEXT3264(local_2460);
      auVar108 = ZEXT3264(local_2480);
      auVar111 = ZEXT3264(local_24a0);
      auVar114 = ZEXT3264(local_24c0);
      auVar117 = ZEXT3264(local_2620);
    }
    if (pauVar31 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }